

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O3

base_learner * log_multi_setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  parser *ppVar2;
  options_i *options_00;
  int iVar3;
  log_multi *d;
  option_group_definition *poVar4;
  typed_option<unsigned_int> *ptVar5;
  loss_function *plVar6;
  base_learner *l;
  single_learner *base;
  learner<log_multi,_example> *plVar7;
  long lVar8;
  undefined **ppuVar9;
  label_parser *plVar10;
  byte bVar11;
  size_type __dnew_4;
  option_group_definition new_options;
  string loss_function;
  size_type __dnew_1;
  size_type __dnew_3;
  size_type __dnew_2;
  _func_int ***local_440;
  _func_int **local_438;
  _func_int **local_430 [2];
  bool *local_420;
  options_i *local_418;
  long local_410;
  _func_int ***local_408;
  _func_int **local_400;
  _func_int **local_3f8 [2];
  _func_int ***local_3e8;
  _func_int **local_3e0;
  _func_int **local_3d8 [2];
  _func_int ***local_3c8;
  _func_int **local_3c0;
  _func_int **local_3b8 [2];
  string local_3a8;
  string local_388;
  string local_368;
  option_group_definition local_348;
  string local_310;
  long *local_2f0;
  long local_2e8;
  long local_2e0 [2];
  undefined1 local_2d0 [112];
  bool local_260;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_238;
  string local_230;
  undefined1 local_210 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  typed_option<unsigned_int> local_170;
  typed_option<unsigned_int> local_d0;
  
  bVar11 = 0;
  local_418 = options;
  d = calloc_or_throw<log_multi>(1);
  *(undefined8 *)d = 0;
  (d->nodes)._begin = (node *)0x0;
  (d->nodes)._end = (node *)0x0;
  (d->nodes).end_array = (node *)0x0;
  (d->nodes).erase_count = 0;
  d->max_predictors = 0;
  d->predictors_used = 0;
  d->progress = false;
  *(undefined3 *)&d->field_0x39 = 0;
  d->swap_resist = 0;
  *(undefined8 *)&d->nbofswaps = 0;
  local_2d0._0_8_ = (_func_int **)0x20;
  local_440 = local_430;
  local_440 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_440,(ulong)local_2d0);
  local_430[0] = (_func_int **)local_2d0._0_8_;
  local_440[2] = (_func_int **)0x6c6369746c754d20;
  local_440[3] = (_func_int **)0x6565725420737361;
  *(undefined4 *)local_440 = 0x61676f4c;
  builtin_strncpy((char *)((long)local_440 + 4),"rith",4);
  *(undefined4 *)(local_440 + 1) = 0x2063696d;
  builtin_strncpy((char *)((long)local_440 + 0xc),"Time",4);
  local_438 = (_func_int **)local_2d0._0_8_;
  *(char *)((long)local_440 + local_2d0._0_8_) = '\0';
  local_348.m_name._M_dataplus._M_p = (pointer)&local_348.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_348,local_440,(char *)(local_2d0._0_8_ + (long)local_440));
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_440 != local_430) {
    operator_delete(local_440);
  }
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  local_368.field_2._M_allocated_capacity = 0x746c756d5f676f6c;
  local_368.field_2._8_2_ = 0x69;
  local_368._M_string_length = 9;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_2d0,&local_368,&d->k);
  local_260 = true;
  local_3c8 = local_3b8;
  local_210._0_8_ = (_func_int **)0x1e;
  local_3c8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_3c8,(ulong)local_210);
  local_3b8[0] = (_func_int **)local_210._0_8_;
  builtin_strncpy((char *)((long)local_3c8 + 0xe),"e for mu",8);
  builtin_strncpy((char *)((long)local_3c8 + 0x16),"lticlass",8);
  *local_3c8 = (_func_int **)0x696c6e6f20657355;
  local_3c8[1] = (_func_int **)0x206565727420656e;
  local_3c0 = (_func_int **)local_210._0_8_;
  *(char *)((long)local_3c8 + local_210._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_2d0 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (&local_348,(typed_option<unsigned_int> *)local_2d0);
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_388.field_2._M_allocated_capacity._0_7_ = 0x676f72705f6f6e;
  local_388.field_2._7_4_ = 0x73736572;
  local_388._M_string_length = 0xb;
  local_388.field_2._M_local_buf[0xb] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_210,&local_388,&d->progress);
  local_3e8 = local_3d8;
  local_d0.super_base_option._vptr_base_option = (_func_int **)0x1e;
  local_3e8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_3e8,(ulong)&local_d0);
  local_3d8[0] = local_d0.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_3e8 + 0xe),"ssive va",8);
  builtin_strncpy((char *)((long)local_3e8 + 0x16),"lidation",8);
  *local_3e8 = (_func_int **)0x20656c6261736964;
  local_3e8[1] = (_func_int **)0x73736572676f7270;
  local_3e0 = local_d0.super_base_option._vptr_base_option;
  *(char *)((long)local_3e8 + (long)local_d0.super_base_option._vptr_base_option) = '\0';
  local_420 = &d->progress;
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar4,(typed_option<bool> *)local_210);
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  local_3a8.field_2._M_allocated_capacity._0_7_ = 0x65725f70617773;
  local_3a8.field_2._M_local_buf[7] = 's';
  local_3a8.field_2._8_7_ = 0x65636e61747369;
  local_3a8._M_string_length = 0xf;
  local_3a8.field_2._M_local_buf[0xf] = '\0';
  VW::config::typed_option<unsigned_int>::typed_option(&local_d0,&local_3a8,&d->swap_resist);
  ptVar5 = VW::config::typed_option<unsigned_int>::default_value(&local_d0,4);
  local_408 = local_3f8;
  local_170.super_base_option._vptr_base_option = (_func_int **)0x1e;
  local_408 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_408,(ulong)&local_170);
  local_3f8[0] = local_170.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_408 + 0xe),"ssive va",8);
  builtin_strncpy((char *)((long)local_408 + 0x16),"lidation",8);
  *local_408 = (_func_int **)0x20656c6261736964;
  local_408[1] = (_func_int **)0x73736572676f7270;
  local_400 = local_170.super_base_option._vptr_base_option;
  *(char *)((long)local_408 + (long)local_170.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (poVar4,ptVar5);
  local_230.field_2._M_allocated_capacity._0_7_ = 0x65725f70617773;
  local_230.field_2._M_local_buf[7] = 's';
  local_230.field_2._8_7_ = 0x65636e61747369;
  local_230._M_string_length = 0xf;
  local_230.field_2._M_local_buf[0xf] = '\0';
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  VW::config::typed_option<unsigned_int>::typed_option(&local_170,&local_230,&d->swap_resist);
  ptVar5 = VW::config::typed_option<unsigned_int>::default_value(&local_170,4);
  local_410 = 0x2b;
  local_2f0 = local_2e0;
  local_2f0 = (long *)std::__cxx11::string::_M_create((ulong *)&local_2f0,(ulong)&local_410);
  local_2e0[0] = local_410;
  builtin_strncpy((char *)((long)local_2f0 + 0x1b)," swap, d",8);
  builtin_strncpy((char *)((long)local_2f0 + 0x23),"efault=4",8);
  local_2f0[2] = 0x65636e6174736973;
  local_2f0[3] = 0x70617773206f7420;
  *local_2f0 = 0x3d20726568676968;
  local_2f0[1] = 0x65722065726f6d20;
  local_2e8 = local_410;
  *(char *)((long)local_2f0 + local_410) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>(poVar4,ptVar5);
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_0030afa8;
  if (local_170.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if (local_408 != local_3f8) {
    operator_delete(local_408);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_0030afa8;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if (local_3e8 != local_3d8) {
    operator_delete(local_3e8);
  }
  local_210._0_8_ = &PTR__typed_option_00308c78;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  if (local_3c8 != local_3b8) {
    operator_delete(local_3c8);
  }
  local_2d0._0_8_ = &PTR__typed_option_0030afa8;
  if (local_238._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238._M_pi);
  }
  options_00 = local_418;
  if (local_248._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_248._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p);
  }
  (**options_00->_vptr_options_i)(options_00,&local_348);
  pp_Var1 = (_func_int **)(local_2d0 + 0x10);
  local_2d0._16_8_ = 0x746c756d5f676f6c;
  local_2d0._24_2_ = 0x69;
  local_2d0._8_8_ = (pointer)0x9;
  local_2d0._0_8_ = pp_Var1;
  iVar3 = (*options_00->_vptr_options_i[1])(options_00,local_2d0);
  if ((_func_int **)local_2d0._0_8_ != pp_Var1) {
    operator_delete((void *)local_2d0._0_8_);
  }
  if ((char)iVar3 == '\0') {
    plVar7 = (learner<log_multi,_example> *)0x0;
  }
  else {
    *local_420 = (bool)(*local_420 ^ 1);
    local_2d0._16_8_ = 0x656c69746e617571;
    local_2d0._8_8_ = (pointer)0x8;
    local_2d0._24_2_ = local_2d0._24_2_ & 0xff00;
    local_2d0._0_8_ = pp_Var1;
    if (all->loss != (loss_function *)0x0) {
      (*all->loss->_vptr_loss_function[9])();
    }
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_310,local_2d0._0_8_,(pointer)(local_2d0._8_8_ + local_2d0._0_8_));
    plVar6 = getLossFunction(all,&local_310,0.5);
    all->loss = plVar6;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    d->max_predictors = (ulong)(d->k - 1);
    init_tree(d);
    l = setup_base(options_00,all);
    base = LEARNER::as_singleline<char,char>(l);
    ppVar2 = all->p;
    plVar7 = LEARNER::learner<log_multi,example>::init_learner<LEARNER::learner<char,example>>
                       (d,base,learn,predict,d->max_predictors,multiclass);
    *(undefined8 *)(plVar7 + 0x58) = *(undefined8 *)(plVar7 + 0x18);
    *(code **)(plVar7 + 0x68) = MULTICLASS::finish_example<log_multi>;
    ppuVar9 = &MULTICLASS::mc_label;
    plVar10 = &ppVar2->lp;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      plVar10->default_label = (_func_void_void_ptr *)*ppuVar9;
      ppuVar9 = ppuVar9 + (ulong)bVar11 * -2 + 1;
      plVar10 = (label_parser *)((long)plVar10 + (ulong)bVar11 * -0x10 + 8);
    }
    *(code **)(plVar7 + 0x80) = save_load_tree;
    *(undefined8 *)(plVar7 + 0x70) = *(undefined8 *)(plVar7 + 0x18);
    *(undefined8 *)(plVar7 + 0x78) = *(undefined8 *)(plVar7 + 0x20);
    *(undefined8 *)(plVar7 + 0xb8) = *(undefined8 *)(plVar7 + 0x18);
    *(undefined8 *)(plVar7 + 0xc0) = *(undefined8 *)(plVar7 + 0x20);
    *(code **)(plVar7 + 200) = finish;
    if ((_func_int **)local_2d0._0_8_ != pp_Var1) {
      operator_delete((void *)local_2d0._0_8_);
    }
    d = (log_multi *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_348.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348.m_name._M_dataplus._M_p != &local_348.m_name.field_2) {
    operator_delete(local_348.m_name._M_dataplus._M_p);
  }
  if (d != (log_multi *)0x0) {
    free(d);
  }
  return (base_learner *)plVar7;
}

Assistant:

base_learner* log_multi_setup(options_i& options, vw& all)  // learner setup
{
  auto data = scoped_calloc_or_throw<log_multi>();
  option_group_definition new_options("Logarithmic Time Multiclass Tree");
  new_options.add(make_option("log_multi", data->k).keep().help("Use online tree for multiclass"))
      .add(make_option("no_progress", data->progress).help("disable progressive validation"))
      .add(make_option("swap_resistance", data->swap_resist).default_value(4).help("disable progressive validation"))
      .add(make_option("swap_resistance", data->swap_resist)
               .default_value(4)
               .help("higher = more resistance to swap, default=4"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("log_multi"))
    return nullptr;

  data->progress = !data->progress;

  string loss_function = "quantile";
  float loss_parameter = 0.5;
  delete (all.loss);
  all.loss = getLossFunction(all, loss_function, loss_parameter);

  data->max_predictors = data->k - 1;
  init_tree(*data.get());

  learner<log_multi, example>& l = init_multiclass_learner(
      data, as_singleline(setup_base(options, all)), learn, predict, all.p, data->max_predictors);
  l.set_save_load(save_load_tree);
  l.set_finish(finish);

  return make_base(l);
}